

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O3

float norm(float *v,int n)

{
  ulong uVar1;
  float fVar2;
  
  fVar2 = 0.0;
  if (0 < n) {
    uVar1 = 0;
    do {
      fVar2 = fVar2 + v[uVar1] * v[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  if (0.0 <= fVar2) {
    return SQRT(fVar2);
  }
  fVar2 = sqrtf(fVar2);
  return fVar2;
}

Assistant:

float norm(float v[],int n)
{
int i;
float sum = 0.0;

for (i=0;i<n; i++)
        sum += (v[i]*v[i]);
sum = (float) sqrt(sum);
return sum;
}